

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O2

ion_err_t flat_file_scan(ion_flat_file_t *flat_file,ion_fpos_t start_location,ion_fpos_t *location,
                        ion_flat_file_row_t *row,ion_byte_t scan_direction,
                        ion_flat_file_predicate_t predicate,...)

{
  ion_byte_t *piVar1;
  bool bVar2;
  char in_AL;
  ion_boolean_t iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  ion_flat_file_row_status_t *piVar8;
  long lVar9;
  ion_err_t iVar10;
  ulong __n;
  long __off;
  size_t sVar11;
  char cVar12;
  long lVar13;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list predicate_arguments;
  long local_128;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  cVar12 = (char)_scan_direction;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  lVar13 = flat_file->start_of_data;
  lVar9 = flat_file->row_size * start_location + lVar13;
  if (_scan_direction == 1) {
    lVar7 = flat_file->eof_position;
    local_128 = lVar7;
    __off = lVar13;
    if (start_location == -1) goto LAB_001063ac;
  }
  else {
    if (start_location == -1) {
      lVar9 = flat_file->eof_position;
    }
    local_128 = lVar13;
    if (cVar12 == '\0') {
      lVar7 = flat_file->eof_position;
      sVar11 = flat_file->row_size;
      if (lVar9 == lVar7) {
        sVar11 = 0;
      }
      __off = sVar11 + lVar9;
      goto LAB_001063ac;
    }
  }
  lVar7 = flat_file->eof_position;
  __off = lVar9;
LAB_001063ac:
  iVar10 = '\x13';
  if (lVar13 <= __off && __off <= lVar7) {
    while (local_128 - __off != 0) {
      iVar4 = fseek((FILE *)flat_file->data_file,__off,0);
      if (iVar4 != 0) {
        return '\r';
      }
      __n = (ulong)flat_file->num_buffered;
      if (cVar12 == '\x01') {
        uVar5 = (ulong)(local_128 - __off) / flat_file->row_size;
        if (uVar5 < __n) {
          __n = uVar5;
        }
        sVar6 = fread(flat_file->buffer,flat_file->row_size,__n,(FILE *)flat_file->data_file);
        if (__n != sVar6) {
          return '\b';
        }
        lVar9 = ftell((FILE *)flat_file->data_file);
        lVar13 = __off;
        if (lVar9 == -1) {
          return '\b';
        }
      }
      else {
        lVar13 = flat_file->start_of_data;
        lVar9 = __off - flat_file->row_size * __n;
        if (lVar13 - lVar9 != 0 && lVar9 <= lVar13) {
          __n = __n - (ulong)(lVar13 - lVar9) / flat_file->row_size;
          lVar9 = lVar13;
        }
        iVar4 = fseek((FILE *)flat_file->data_file,lVar9,0);
        if (iVar4 != 0) {
          return '\r';
        }
        sVar6 = fread(flat_file->buffer,flat_file->row_size,__n,(FILE *)flat_file->data_file);
        lVar13 = lVar9;
        if (__n != sVar6) {
          return '\b';
        }
      }
      flat_file->current_loaded_region =
           (ulong)(lVar13 - flat_file->start_of_data) / flat_file->row_size;
      flat_file->num_in_buffer = __n;
      uVar5 = (ulong)((int)__n + -1);
      if (cVar12 == '\x01') {
        uVar5 = 0;
      }
      while( true ) {
        bVar2 = -1 < (long)uVar5;
        if (cVar12 == '\x01') {
          bVar2 = uVar5 < __n;
        }
        __off = lVar9;
        if (!bVar2) break;
        lVar7 = flat_file->row_size * uVar5;
        piVar1 = flat_file->buffer;
        piVar8 = piVar1 + lVar7;
        row->row_status = *piVar8;
        row->key = piVar8 + 1;
        row->value = piVar1 + (long)(flat_file->super).record.key_size + 1 + lVar7;
        local_108.reg_save_area = local_e8;
        local_108.overflow_arg_area = &stack0x00000008;
        local_108.gp_offset = 0x30;
        local_108.fp_offset = 0x30;
        iVar3 = (*predicate)(flat_file,row,(va_list *)&local_108);
        if (iVar3 != '\0') {
          *location = (ulong)(lVar13 - flat_file->start_of_data) / flat_file->row_size + uVar5;
          return '\0';
        }
        uVar5 = uVar5 + (ulong)(cVar12 == '\x01') * 2 + -1;
      }
    }
    *location = (ulong)(flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size;
    iVar10 = '\x0e';
  }
  return iVar10;
}

Assistant:

ion_err_t
flat_file_scan(
	ion_flat_file_t				*flat_file,
	ion_fpos_t					start_location,
	ion_fpos_t					*location,
	ion_flat_file_row_t			*row,
	ion_byte_t					scan_direction,
	ion_flat_file_predicate_t	predicate,
	...
) {
	ion_fpos_t	cur_offset	= flat_file->start_of_data + start_location * flat_file->row_size;
	ion_fpos_t	end_offset	= ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? flat_file->eof_position : flat_file->start_of_data;

	if (-1 == start_location) {
		if (ION_FLAT_FILE_SCAN_FORWARDS == scan_direction) {
			cur_offset = flat_file->start_of_data;
		}
		else {
			cur_offset = flat_file->eof_position;
		}
	}

	/* If we're scanning backwards, bump the cur_offset up one record so that we read the record we're sitting on. */
	/* We don't do this if we're positioned at the EOF, since otherwise we would read garbage. */
	if ((ION_FLAT_FILE_SCAN_BACKWARDS == scan_direction) && (cur_offset != flat_file->eof_position)) {
		cur_offset += flat_file->row_size;
	}

	if ((cur_offset > flat_file->eof_position) || (cur_offset < flat_file->start_of_data)) {
		return err_out_of_bounds;
	}

	while (cur_offset != end_offset) {
		if (0 != fseek(flat_file->data_file, cur_offset, SEEK_SET)) {
			return err_file_bad_seek;
		}

		/* We set cur_offset to be the next block to read after this next code segment, so */
		/* we need t save what block we're currently reading now for location calculation purposes */
		ion_fpos_t	prev_offset				= cur_offset;
		size_t		num_records_to_process	= flat_file->num_buffered;

		if (ION_FLAT_FILE_SCAN_FORWARDS == scan_direction) {
			/* It's possible for this to do a partial read (if you're close to EOF), calculate how many we need to read */
			size_t records_left = (end_offset - cur_offset) / flat_file->row_size;

			num_records_to_process = records_left > (unsigned) flat_file->num_buffered ? (unsigned) flat_file->num_buffered : records_left;

			if (num_records_to_process != fread(flat_file->buffer, flat_file->row_size, num_records_to_process, flat_file->data_file)) {
				return err_file_read_error;
			}

			if (-1 == (cur_offset = ftell(flat_file->data_file))) {
				return err_file_read_error;
			}
		}
		else {
			/* Move the offset pointer to the next read location, clamp it at start_of_file if we go too far. */
			cur_offset -= flat_file->row_size * flat_file->num_buffered;

			if (cur_offset < flat_file->start_of_data) {
				/* We know how many rows we went past the start of file, calculate it so we don't fread too much */
				num_records_to_process	= flat_file->num_buffered - (flat_file->start_of_data - cur_offset) / flat_file->row_size;
				cur_offset				= flat_file->start_of_data;
			}

			if (0 != fseek(flat_file->data_file, cur_offset, SEEK_SET)) {
				return err_file_bad_seek;
			}

			if (num_records_to_process != fread(flat_file->buffer, flat_file->row_size, num_records_to_process, flat_file->data_file)) {
				return err_file_read_error;
			}

			/* In this case, the prev_offset is actually the cur_offset. */
			prev_offset = cur_offset;
		}

		flat_file->current_loaded_region	= (prev_offset - flat_file->start_of_data) / flat_file->row_size;
		flat_file->num_in_buffer			= num_records_to_process;

		int32_t i;

		for (i = ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? 0 : num_records_to_process - 1; ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? (size_t) i < num_records_to_process : i >= 0; ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? i++ : i--) {
			size_t cur_rec = i * flat_file->row_size;

			/* This cast is done because in the future, the status could possibly be a non-byte type */
			row->row_status = *((ion_flat_file_row_status_t *) &flat_file->buffer[cur_rec]);
			row->key		= &flat_file->buffer[cur_rec + sizeof(ion_flat_file_row_status_t)];
			row->value		= &flat_file->buffer[cur_rec + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size];

			va_list predicate_arguments;

			va_start(predicate_arguments, predicate);

			ion_boolean_t predicate_test = predicate(flat_file, row, &predicate_arguments);

			va_end(predicate_arguments);

			if (predicate_test) {
				*location = (prev_offset - flat_file->start_of_data) / flat_file->row_size + i;
				return err_ok;
			}
		}
	}

	/* If we reach this point, then no row matched the predicate. */
	*location = (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size;
	return err_file_hit_eof;
}